

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet6_address.cpp
# Opt level: O0

result<in6_addr> *
sockpp::inet6_address::resolve_name(result<in6_addr> *__return_storage_ptr__,string *saddr)

{
  int iVar1;
  char *pcVar2;
  error_code eVar3;
  error_code eVar4;
  undefined1 auStack_a8 [8];
  in6_addr addr;
  sockaddr_in6 *ipv6;
  undefined4 uStack_7c;
  undefined1 local_70 [8];
  error_code ec;
  undefined1 auStack_58 [4];
  int err;
  addrinfo hints;
  addrinfo *res;
  in6_addr ia;
  string *saddr_local;
  
  ia.__in6_u._8_8_ = saddr;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = inet_pton(10,pcVar2,&res);
  if (iVar1 == 1) {
    result<in6_addr>::result(__return_storage_ptr__,(in6_addr *)&res);
  }
  else {
    hints.ai_addr = (sockaddr *)0x0;
    hints.ai_canonname = (char *)0x0;
    hints.ai_socktype = 0;
    hints.ai_protocol = 0;
    hints.ai_addrlen = 0;
    hints._20_4_ = 0;
    auStack_58 = (undefined1  [4])0x0;
    err = 10;
    hints.ai_flags = 1;
    hints.ai_family = 0;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    ec._M_cat._4_4_ =
         getaddrinfo(pcVar2,(char *)0x0,(addrinfo *)auStack_58,(addrinfo **)&hints.ai_next);
    if (ec._M_cat._4_4_ == ~invalid_argument) {
      addr.__in6_u._8_8_ = (hints.ai_next)->ai_addr;
      auStack_a8 = *(undefined1 (*) [8])(((sockaddr *)addr.__in6_u._8_8_)->sa_data + 6);
      addr.__in6_u._0_2_ = ((sockaddr *)(addr.__in6_u._8_8_ + 0x10))->sa_family;
      addr.__in6_u._2_1_ = ((sockaddr *)(addr.__in6_u._8_8_ + 0x10))->sa_data[0];
      addr.__in6_u._3_1_ = ((sockaddr *)(addr.__in6_u._8_8_ + 0x10))->sa_data[1];
      addr.__in6_u._4_1_ = ((sockaddr *)(addr.__in6_u._8_8_ + 0x10))->sa_data[2];
      addr.__in6_u._5_1_ = ((sockaddr *)(addr.__in6_u._8_8_ + 0x10))->sa_data[3];
      addr.__in6_u._6_1_ = ((sockaddr *)(addr.__in6_u._8_8_ + 0x10))->sa_data[4];
      addr.__in6_u._7_1_ = ((sockaddr *)(addr.__in6_u._8_8_ + 0x10))->sa_data[5];
      freeaddrinfo((addrinfo *)hints.ai_next);
      result<in6_addr>::result(__return_storage_ptr__,(in6_addr *)auStack_a8);
    }
    else {
      std::error_code::error_code((error_code *)local_70);
      if (ec._M_cat._4_4_ == system_error) {
        eVar3 = result<sockpp::none>::last_error();
        ec._0_8_ = eVar3._M_cat;
        local_70._4_4_ = uStack_7c;
        local_70._0_4_ = eVar3._M_value;
      }
      else {
        eVar4 = make_error_code(ec._M_cat._4_4_);
        ec._0_8_ = eVar4._M_cat;
        local_70._4_4_ = ipv6._4_4_;
        local_70._0_4_ = eVar4._M_value;
      }
      result<in6_addr>::result(__return_storage_ptr__,(error_code *)local_70);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

result<in6_addr> inet6_address::resolve_name(const string& saddr) noexcept {
#if !defined(_WIN32)
    in6_addr ia;
    if (::inet_pton(ADDRESS_FAMILY, saddr.c_str(), &ia) == 1)
        return ia;
#endif

    addrinfo *res, hints = addrinfo{};
    hints.ai_family = ADDRESS_FAMILY;
    hints.ai_socktype = SOCK_STREAM;

    int err = ::getaddrinfo(saddr.c_str(), NULL, &hints, &res);

    if (err != 0) {
        error_code ec{};
#if defined(_WIN32)
        ec = error_code{errno, system_category()};
#else
        if (err == EAI_SYSTEM)
            ec = result<>::last_error();
        else
            ec = make_error_code(static_cast<gai_errc>(err));
#endif
        return ec;
    }

    auto ipv6 = reinterpret_cast<sockaddr_in6*>(res->ai_addr);
    auto addr = ipv6->sin6_addr;
    freeaddrinfo(res);
    return addr;
}